

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_header.cpp
# Opt level: O0

lsp_header * lscpp::parse_header(lsp_header *__return_storage_ptr__,transporter *t)

{
  int iVar1;
  Verbosity VVar2;
  long lVar3;
  double __x;
  double __x_00;
  undefined1 local_d8 [8];
  string line_1;
  string local_b0 [32];
  string local_90;
  string local_60 [32];
  undefined1 local_40 [8];
  string line;
  int content_length;
  transporter *t_local;
  
  transporter::read_line_abi_cxx11_((string *)local_40,t);
  std::__cxx11::string::substr((ulong)local_60,(ulong)local_40);
  iVar1 = std::__cxx11::string::compare((char *)local_60);
  std::__cxx11::string::~string(local_60);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_40);
    line.field_2._12_4_ = std::__cxx11::stoi(&local_90,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_90);
    line_1.field_2._8_4_ = 0;
  }
  else {
    line_1.field_2._M_local_buf[0xf] = '\0';
    VVar2 = loguru::current_verbosity_cutoff();
    if (-3 < VVar2) {
      std::__cxx11::string::substr((ulong)local_b0,(ulong)local_40);
      line_1.field_2._M_local_buf[0xf] = '\x01';
      __x = (double)std::__cxx11::string::c_str();
      loguru::log(__x);
    }
    if ((line_1.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::~string(local_b0);
    }
    __return_storage_ptr__->content_length = -1;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&__return_storage_ptr__->content_type);
    line_1.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  if (line_1.field_2._8_4_ == 0) {
    transporter::read_line_abi_cxx11_((string *)local_d8,t);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) {
      __return_storage_ptr__->content_length = line.field_2._12_4_;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&__return_storage_ptr__->content_type);
    }
    line_1.field_2._9_3_ = 0;
    line_1.field_2._M_local_buf[8] = lVar3 == 0;
    std::__cxx11::string::~string((string *)local_d8);
    if (line_1.field_2._8_4_ == 0) {
      VVar2 = loguru::current_verbosity_cutoff();
      if (-3 < VVar2) {
        loguru::log(__x_00);
      }
      __return_storage_ptr__->content_length = -1;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&__return_storage_ptr__->content_type);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

lsp_header parse_header(transporter &t) {
  int content_length;
  if (auto line = t.read_line();
      line.substr(0, 16).compare("Content-Length: ") == 0) {
    content_length = std::stoi(line.substr(16, std::string::npos));
  } else {
    LOG_F(ERROR,
          "Failed parsing header, got '%s' instead of 'Content-Length: '",
          line.substr(0, 16).c_str());
    return {-1}; // TODO return a proper error on failure.
  }

  if (auto line = t.read_line(); line.size() == 0) // a new line
    return {content_length};                       // valid header

  LOG_F(ERROR, "Failed parsing header!");
  return {-1};
}